

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O3

WebPInputFileFormat WebPGuessImageType(uint8_t *data,size_t data_size)

{
  WebPInputFileFormat WVar1;
  uint uVar2;
  uint uVar3;
  
  WVar1 = WEBP_UNSUPPORTED_FORMAT;
  if (0xb < data_size && data != (uint8_t *)0x0) {
    uVar3 = (uint)data[2] << 8 | (uint)data[1] << 0x10 | (uint)*data << 0x18;
    uVar2 = data[3] | uVar3;
    WVar1 = WEBP_PNG_FORMAT;
    if ((((uVar2 != 0x89504e47) && (WVar1 = WEBP_JPEG_FORMAT, uVar3 != 0xffd8ff00)) &&
        (WVar1 = WEBP_TIFF_FORMAT, uVar2 != 0x49492a00)) && (uVar2 != 0x4d4d002a)) {
      if ((uVar2 == 0x52494646) &&
         (uVar2 = *(uint *)(data + 8),
         (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
         0x57454250)) {
        return WEBP_WEBP_FORMAT;
      }
      WVar1 = WEBP_UNSUPPORTED_FORMAT;
      if (*data == 0x50) {
        WVar1 = WEBP_UNSUPPORTED_FORMAT - (data[1] - 0x35 < 3);
      }
    }
  }
  return WVar1;
}

Assistant:

WebPInputFileFormat WebPGuessImageType(const uint8_t* const data,
                                       size_t data_size) {
  WebPInputFileFormat format = WEBP_UNSUPPORTED_FORMAT;
  if (data != NULL && data_size >= 12) {
    const uint32_t magic1 = GetBE32(data + 0);
    const uint32_t magic2 = GetBE32(data + 8);
    if (magic1 == 0x89504E47U) {
      format = WEBP_PNG_FORMAT;
    } else if (magic1 >= 0xFFD8FF00U && magic1 <= 0xFFD8FFFFU) {
      format = WEBP_JPEG_FORMAT;
    } else if (magic1 == 0x49492A00 || magic1 == 0x4D4D002A) {
      format = WEBP_TIFF_FORMAT;
    } else if (magic1 == 0x52494646 && magic2 == 0x57454250) {
      format = WEBP_WEBP_FORMAT;
    } else if (((magic1 >> 24) & 0xff) == 'P') {
      const int type = (magic1 >> 16) & 0xff;
      // we only support 'P5 -> P7' for now.
      if (type >= '5' && type <= '7') format = WEBP_PNM_FORMAT;
    }
  }
  return format;
}